

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  expdesc *var;
  lu_byte *plVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  FuncState *pFVar5;
  expdesc e;
  
  if (2 < (lh->v).k - VLOCAL) {
    luaX_syntaxerror(ls,"syntax error");
  }
  var = &lh->v;
  iVar4 = testnext(ls,0x2c);
  if (iVar4 == 0) {
    checknext(ls,0x3d);
    iVar4 = explist(ls,&e);
    if (nvars == iVar4) {
      luaK_setoneret(ls->fs,&e);
      pFVar5 = ls->fs;
      goto LAB_0010cddd;
    }
    adjust_assign(ls,nvars,iVar4,&e);
    if (nvars < iVar4) {
      plVar1 = &ls->fs->freereg;
      *plVar1 = *plVar1 + ((char)nvars - (char)iVar4);
    }
  }
  else {
    e._0_8_ = lh;
    suffixedexp(ls,(expdesc *)&e.u.ind);
    if (e.u.info != 9) {
      pFVar5 = ls->fs;
      bVar2 = pFVar5->freereg;
      bVar3 = false;
      for (; lh != (LHS_assign *)0x0; lh = lh->prev) {
        if ((lh->v).k == VINDEXED) {
          if ((e.u.info == (uint)(lh->v).u.ind.vt) && (e.t == (uint)(lh->v).u.ind.t)) {
            (lh->v).u.ind.vt = '\a';
            (lh->v).u.ind.t = bVar2;
            bVar3 = true;
          }
          if ((e.u.info == 7) && (e.t == (lh->v).u.ind.idx)) {
            *(ushort *)&(lh->v).u = (ushort)bVar2;
            bVar3 = true;
          }
        }
      }
      if (bVar3) {
        luaK_codeABC(pFVar5,(uint)(e.u.info != 7) * 5,(uint)bVar2,e.t,0);
        luaK_reserveregs(pFVar5,1);
      }
    }
    checklimit(ls->fs,(uint)ls->L->nCcalls + nvars,200,"C levels");
    assignment(ls,(LHS_assign *)&e,nvars + 1);
  }
  pFVar5 = ls->fs;
  e.t = -1;
  e.f = -1;
  e.u.info = pFVar5->freereg - 1;
  e.k = VNONRELOC;
LAB_0010cddd:
  luaK_storevar(pFVar5,var,&e);
  return;
}

Assistant:

static void assignment (LexState *ls, struct LHS_assign *lh, int nvars) {
  expdesc e;
  check_condition(ls, vkisvar(lh->v.k), "syntax error");
  if (testnext(ls, ',')) {  /* assignment -> ',' suffixedexp assignment */
    struct LHS_assign nv;
    nv.prev = lh;
    suffixedexp(ls, &nv.v);
    if (nv.v.k != VINDEXED)
      check_conflict(ls, lh, &nv.v);
    checklimit(ls->fs, nvars + ls->L->nCcalls, LUAI_MAXCCALLS,
                    "C levels");
    assignment(ls, &nv, nvars+1);
  }
  else {  /* assignment -> `=' explist */
    int nexps;
    checknext(ls, '=');
    nexps = explist(ls, &e);
    if (nexps != nvars) {
      adjust_assign(ls, nvars, nexps, &e);
      if (nexps > nvars)
        ls->fs->freereg -= nexps - nvars;  /* remove extra values */
    }
    else {
      luaK_setoneret(ls->fs, &e);  /* close last expression */
      luaK_storevar(ls->fs, &lh->v, &e);
      return;  /* avoid default */
    }
  }
  init_exp(&e, VNONRELOC, ls->fs->freereg-1);  /* default assignment */
  luaK_storevar(ls->fs, &lh->v, &e);
}